

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O1

void __thiscall
HighsCliqueTable::extractCliquesFromCut
          (HighsCliqueTable *this,HighsMipSolver *mipsolver,HighsInt *inds,double *vals,HighsInt len
          ,double rhs)

{
  HighsDomain *this_00;
  double *pdVar1;
  HighsMipSolverData *pHVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  HighsMipSolver *pHVar6;
  HighsInt *pHVar7;
  int *piVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  int *piVar13;
  HighsInt HVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  HighsInt j;
  ulong uVar19;
  pointer piVar20;
  iterator j_1;
  pointer piVar21;
  bool bVar22;
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  int iVar29;
  undefined1 auVar28 [16];
  HighsDomainChange boundchg;
  vector<int,_std::allocator<int>_> perm;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> clique;
  int local_128;
  HighsInt local_124;
  double *local_120;
  HighsMipSolver *local_118;
  HighsInt *local_110;
  double local_108;
  HighsImplications *local_100;
  vector<int,_std::allocator<int>_> local_f8;
  HighsCliqueTable *local_d8;
  pointer local_d0;
  double local_c8;
  pointer local_c0;
  double local_b8;
  undefined8 uStack_b0;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> local_a8;
  double local_88;
  undefined8 uStack_80;
  ulong local_78;
  double *local_70;
  double local_68;
  undefined8 uStack_60;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  ulong local_50;
  long local_48;
  double local_40;
  double local_38;
  
  if (this->numEntries < this->maxEntries) {
    pHVar2 = (mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    bVar22 = len == 0;
    if (bVar22) {
      local_100 = (HighsImplications *)CONCAT71(local_100._1_7_,1);
      local_68 = 0.0;
      local_88 = 0.0;
    }
    else {
      uVar19 = 0;
      uVar11 = 0;
      local_88 = 0.0;
      dVar23 = 0.0;
      do {
        lVar17 = (long)inds[uVar19];
        uVar18 = 0;
        if (*(char *)(*(long *)&(((pHVar2->domain).mipsolver)->model_->integrality_).
                                super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                                _M_impl + lVar17) != '\0') {
          dVar26 = *(double *)
                    (*(long *)&(pHVar2->domain).col_lower_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl +
                    lVar17 * 8);
          uVar18 = 0;
          if ((dVar26 == 0.0) && (!NAN(dVar26))) {
            uVar18 = -(uint)(*(double *)
                              (*(long *)&(pHVar2->domain).col_upper_.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                              + lVar17 * 8) == 1.0) & 1;
          }
        }
        uVar11 = uVar11 + uVar18;
        local_68 = dVar23;
        if (vals[uVar19] <= 0.0) {
          dVar26 = *(double *)
                    (*(long *)&(pHVar2->domain).col_upper_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl +
                    lVar17 * 8);
          if (INFINITY <= dVar26) break;
        }
        else {
          dVar26 = *(double *)
                    (*(long *)&(pHVar2->domain).col_lower_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl +
                    lVar17 * 8);
          if (dVar26 <= -INFINITY) break;
        }
        dVar26 = vals[uVar19] * dVar26;
        local_68 = dVar23 + dVar26;
        local_88 = local_88 +
                   (dVar23 - (local_68 - dVar26)) + (dVar26 - (local_68 - (local_68 - dVar26)));
        uVar19 = uVar19 + 1;
        bVar22 = (uint)len == uVar19;
        dVar23 = local_68;
      } while (!bVar22);
      local_100 = (HighsImplications *)CONCAT71(local_100._1_7_,uVar11 < 2);
    }
    uStack_80 = 0;
    if (bVar22) {
      local_c8 = pHVar2->feastol;
      uStack_60 = 0;
      local_124 = len;
      local_120 = vals;
      local_118 = mipsolver;
      local_110 = inds;
      local_108 = rhs;
      local_d8 = this;
      local_70 = vals;
      if (len != 0) {
        this_00 = &pHVar2->domain;
        local_c0 = (pointer)(rhs - local_68);
        local_d0 = (pointer)(((rhs - (local_68 + (double)local_c0)) +
                             (-local_68 - ((double)local_c0 - (local_68 + (double)local_c0)))) -
                            local_88);
        uVar19 = 0;
        do {
          pdVar1 = local_120;
          if ((mipsolver->model_->integrality_).
              super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
              super__Vector_impl_data._M_start[local_110[uVar19]] != kContinuous) {
            local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = local_c0;
            local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_d0;
            HighsCDouble::operator/=((HighsCDouble *)&local_f8,local_120[uVar19]);
            pHVar7 = local_110;
            if (pdVar1[uVar19] <= 0.0) {
              local_b8 = (double)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start +
                         (double)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish +
                         *(double *)
                          (*(long *)&(pHVar2->domain).col_upper_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl +
                          (long)local_110[uVar19] * 8);
              dVar23 = HighsDomain::feastol(this_00);
              dVar23 = ceil(local_b8 - dVar23);
              uVar15 = (ulong)(uint)pHVar7[uVar19];
            }
            else {
              local_b8 = (double)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start +
                         (double)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish +
                         *(double *)
                          (*(long *)&(pHVar2->domain).col_lower_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl +
                          (long)local_110[uVar19] * 8);
              dVar23 = HighsDomain::feastol(this_00);
              dVar23 = floor(dVar23 + local_b8);
              uVar15 = (ulong)(uint)pHVar7[uVar19] + 0x100000000;
            }
            boundchg.column = (int)uVar15;
            boundchg.boundtype = (int)(uVar15 >> 0x20);
            boundchg.boundval = dVar23;
            HighsDomain::changeBound(this_00,boundchg,(Reason)0xfffffffe);
            mipsolver = local_118;
            if ((pHVar2->domain).infeasible_ != false) {
              return;
            }
          }
          uVar19 = uVar19 + 1;
        } while ((uint)len != uVar19);
      }
      HVar14 = local_124;
      if ((char)local_100 == '\0') {
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (int *)0x0;
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (int *)0x0;
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::resize(&local_f8,(long)local_124);
        auVar5 = _DAT_003c57d0;
        auVar4 = _DAT_003c57c0;
        auVar3 = _DAT_003c57b0;
        local_58._M_current =
             local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
        if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start !=
            local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          uVar19 = (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish +
                   (-4 - (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start);
          auVar28._8_4_ = (int)uVar19;
          auVar28._0_8_ = uVar19;
          auVar28._12_4_ = (int)(uVar19 >> 0x20);
          auVar24._0_8_ = uVar19 >> 2;
          auVar24._8_8_ = auVar28._8_8_ >> 2;
          uVar15 = 0;
          auVar24 = auVar24 ^ _DAT_003c57d0;
          do {
            iVar9 = (int)uVar15;
            auVar27._8_4_ = iVar9;
            auVar27._0_8_ = uVar15;
            auVar27._12_4_ = (int)(uVar15 >> 0x20);
            auVar28 = (auVar27 | auVar4) ^ auVar5;
            iVar12 = auVar24._4_4_;
            if ((bool)(~(auVar28._4_4_ == iVar12 && auVar24._0_4_ < auVar28._0_4_ ||
                        iVar12 < auVar28._4_4_) & 1)) {
              local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar15] = iVar9;
            }
            if ((auVar28._12_4_ != auVar24._12_4_ || auVar28._8_4_ <= auVar24._8_4_) &&
                auVar28._12_4_ <= auVar24._12_4_) {
              local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar15 + 1] = iVar9 + 1;
            }
            auVar28 = (auVar27 | auVar3) ^ auVar5;
            iVar29 = auVar28._4_4_;
            if (iVar29 <= iVar12 && (iVar29 != iVar12 || auVar28._0_4_ <= auVar24._0_4_)) {
              local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar15 + 2] = iVar9 + 2;
              local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar15 + 3] = iVar9 + 3;
            }
            uVar15 = uVar15 + 4;
          } while (((uVar19 >> 2) + 4 & 0xfffffffffffffffc) != uVar15);
          if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start !=
              local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish) {
            lVar17 = *(long *)&(((pHVar2->domain).mipsolver)->model_->integrality_).
                               super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                               _M_impl;
            piVar8 = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar13 = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            do {
              while( true ) {
                local_58._M_current = piVar8;
                iVar12 = *local_58._M_current;
                lVar16 = (long)local_110[iVar12];
                if ((((*(char *)(lVar17 + lVar16) == '\0') ||
                     (dVar23 = *(double *)
                                (*(long *)&(pHVar2->domain).col_lower_.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl + lVar16 * 8), dVar23 != 0.0)) || (NAN(dVar23)))
                   || ((dVar23 = *(double *)
                                  (*(long *)&(pHVar2->domain).col_upper_.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl + lVar16 * 8), dVar23 != 1.0 || (NAN(dVar23))))
                   ) break;
                local_58._M_current = local_58._M_current + 1;
                piVar8 = local_58._M_current;
                if (local_58._M_current == piVar13) goto LAB_00263e6e;
              }
              do {
                piVar13 = piVar13 + -1;
                if (local_58._M_current == piVar13) goto LAB_00263e6e;
                lVar16 = (long)local_110[*piVar13];
              } while (((*(char *)(lVar17 + lVar16) == '\0') ||
                       (dVar23 = *(double *)
                                  (*(long *)&(pHVar2->domain).col_lower_.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl + lVar16 * 8), dVar23 != 0.0)) ||
                      ((NAN(dVar23) ||
                       ((dVar23 = *(double *)
                                   (*(long *)&(pHVar2->domain).col_upper_.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl + lVar16 * 8), dVar23 != 1.0 || (NAN(dVar23)))
                       ))));
              *local_58._M_current = *piVar13;
              *piVar13 = iVar12;
              piVar8 = local_58._M_current + 1;
            } while (piVar13 != local_58._M_current + 1);
            local_58._M_current = local_58._M_current + 1;
          }
        }
LAB_00263e6e:
        local_78 = (long)local_58._M_current -
                   (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2;
        if ((int)local_78 != 0 && (int)local_78 < HVar14) {
          local_100 = &pHVar2->implications;
          local_38 = local_108 - local_68;
          local_40 = ((local_108 - (local_68 + local_38)) +
                     (-local_68 - (local_38 - (local_68 + local_38)))) - local_88;
          iVar12 = (int)((ulong)((long)local_58._M_current -
                                (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start) >> 2);
          local_48 = (long)iVar12;
          local_50 = local_78 & 0xffffffff;
          local_124 = HVar14 - iVar12;
          uVar19 = 0;
          do {
            local_d0 = (pointer)CONCAT44(local_d0._4_4_,
                                         local_110[local_f8.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar19]])
            ;
            local_c0 = (pointer)(local_38 -
                                ABS(local_120[local_f8.super__Vector_base<int,_std::allocator<int>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar19]]));
            local_b8 = ((double)((ulong)local_120[local_f8.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar19]]
                                | 0x8000000000000000) - ((double)local_c0 - local_38)) +
                       (local_38 - ((double)local_c0 - ((double)local_c0 - local_38))) + local_40;
            uStack_b0 = 0x8000000000000000;
            lVar17 = local_48;
            HVar14 = local_124;
            do {
              piVar20 = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              iVar12 = local_110[local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar17]];
              lVar16 = (long)iVar12;
              dVar23 = *(double *)
                        (*(long *)&(pHVar2->domain).col_lower_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl +
                        lVar16 * 8);
              pdVar1 = (double *)
                       (*(long *)&(pHVar2->domain).col_upper_.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl +
                       lVar16 * 8);
              if ((dVar23 != *pdVar1) || (NAN(dVar23) || NAN(*pdVar1))) {
                dVar23 = local_120[local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[lVar17]];
                if (dVar23 <= 0.0) {
                  dVar26 = *(double *)
                            (*(long *)&(pHVar2->domain).col_upper_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl +
                            lVar16 * 8) * dVar23;
                  dVar25 = (double)local_c0 + dVar26;
                  dVar23 = ((dVar26 - (dVar25 - (double)local_c0)) +
                            ((double)local_c0 - (dVar25 - (dVar25 - (double)local_c0))) + local_b8 +
                           dVar25) / dVar23;
                  if ((local_118->model_->integrality_).
                      super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar16] != kContinuous) {
                    dVar23 = ceil(dVar23 - ((local_118->mipdata_)._M_t.
                                            super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                            .super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                           _M_head_impl)->feastol);
                  }
                  dVar26 = *(double *)
                            (*(long *)&(pHVar2->domain).col_lower_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl +
                            lVar16 * 8);
                  if (local_c8 + dVar26 < dVar23) {
                    if (0.0 < local_120[piVar20[uVar19]] || local_120[piVar20[uVar19]] == 0.0) {
                      if (dVar26 <= -INFINITY) goto LAB_00263fc7;
                      dVar25 = dVar23 - dVar26;
                    }
                    else {
                      dVar25 = dVar26 - dVar23;
                      dVar26 = dVar23;
                    }
                    HighsImplications::addVLB(local_100,iVar12,(HighsInt)local_d0,dVar25,dVar26);
                  }
                }
                else {
                  dVar26 = *(double *)
                            (*(long *)&(pHVar2->domain).col_lower_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl +
                            lVar16 * 8) * dVar23;
                  dVar25 = (double)local_c0 + dVar26;
                  dVar23 = ((dVar26 - (dVar25 - (double)local_c0)) +
                            ((double)local_c0 - (dVar25 - (dVar25 - (double)local_c0))) + local_b8 +
                           dVar25) / dVar23;
                  if ((local_118->model_->integrality_).
                      super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar16] != kContinuous) {
                    dVar23 = floor(dVar23 + ((local_118->mipdata_)._M_t.
                                             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                             .super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                            _M_head_impl)->feastol);
                  }
                  dVar26 = *(double *)
                            (*(long *)&(pHVar2->domain).col_upper_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl +
                            lVar16 * 8);
                  if (dVar23 < dVar26 - local_c8) {
                    if (0.0 < local_120[piVar20[uVar19]] || local_120[piVar20[uVar19]] == 0.0) {
                      if (INFINITY <= dVar26) goto LAB_00263fc7;
                      dVar25 = dVar23 - dVar26;
                    }
                    else {
                      dVar25 = dVar26 - dVar23;
                      dVar26 = dVar23;
                    }
                    HighsImplications::addVUB(local_100,iVar12,(HighsInt)local_d0,dVar25,dVar26);
                  }
                }
              }
LAB_00263fc7:
              lVar17 = lVar17 + 1;
              HVar14 = HVar14 + -1;
            } while (HVar14 != 0);
            uVar19 = uVar19 + 1;
          } while (uVar19 != local_50);
        }
        uVar11 = (uint)local_78;
        if (1 < (int)uVar11) {
          local_a8.
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          ._M_impl.super__Vector_impl_data._M_start = (CliqueVar *)0x0;
          local_a8.
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          ._M_impl.super__Vector_impl_data._M_finish = (CliqueVar *)0x0;
          local_a8.
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          reserve(&local_a8,(ulong)(uVar11 & 0x7fffffff));
          pHVar6 = local_118;
          if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != local_58._M_current) {
            uVar19 = (long)local_58._M_current -
                     (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2;
            iVar12 = 0;
            if (1 < uVar19) {
              iVar12 = 0;
              do {
                uVar19 = (long)uVar19 >> 1;
                iVar12 = iVar12 + 1;
              } while (1 < uVar19);
            }
            pdqsort_detail::
            pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1,false>
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,local_58,(anon_class_8_1_8992ca70)&local_70,
                       iVar12,true);
          }
          pdVar1 = local_70;
          local_b8 = local_108 - local_68;
          local_108 = ((local_108 - (local_68 + local_b8)) +
                      (-local_68 - (local_b8 - (local_68 + local_b8)))) - local_88;
          dVar23 = local_c8 + local_b8;
          if ((local_c8 - (dVar23 - local_b8)) + (local_b8 - (dVar23 - (dVar23 - local_b8))) +
              local_108 + dVar23 <
              ABS(local_70[local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[1]]) +
              ABS(local_70[*local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start])) {
            iVar12 = ((pHVar6->mipdata_)._M_t.
                      super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                      .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                     numCliqueEntriesAfterPresolve;
            HVar14 = HighsSparseMatrix::numNz(&((pHVar2->domain).mipsolver)->model_->a_matrix_);
            pHVar7 = local_110;
            iVar9 = iVar12 + HVar14 * 4 + 100000;
            iVar12 = local_d8->numEntries + uVar11 * 10;
            if (iVar9 <= iVar12) {
              iVar12 = iVar9;
            }
            local_120 = (double *)CONCAT44(local_120._4_4_,iVar12);
            if ((uVar11 - 1 != 0) && (local_d8->numEntries < iVar9)) {
              uVar19 = (ulong)(uVar11 - 1);
              do {
                dVar23 = local_b8 -
                         ABS(pdVar1[local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar19]]);
                dVar26 = local_c8 + dVar23;
                uVar15 = uVar19;
                piVar20 = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                do {
                  uVar10 = uVar15 >> 1;
                  if ((local_c8 - (dVar26 - dVar23)) + (dVar23 - (dVar26 - (dVar26 - dVar23))) +
                      ((double)((ulong)pdVar1[local_f8.super__Vector_base<int,_std::allocator<int>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar19]] |
                               (ulong)DAT_003c50b0) - (dVar23 - local_b8)) +
                      (local_b8 - (dVar23 - (dVar23 - local_b8))) + local_108 + dVar26 <
                      ABS(pdVar1[piVar20[uVar10]])) {
                    piVar20 = piVar20 + uVar10 + 1;
                    uVar10 = ~uVar10 + uVar15;
                  }
                  uVar15 = uVar10;
                } while (0 < (long)uVar10);
                if (piVar20 ==
                    local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start) {
                  bVar22 = false;
                }
                else {
                  piVar21 = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  if (local_a8.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      local_a8.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
                    local_a8.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         local_a8.
                         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                  }
                  for (; piVar21 != piVar20; piVar21 = piVar21 + 1) {
                    piVar13 = pHVar7 + *piVar21;
                    if (0.0 < pdVar1[*piVar21] || pdVar1[*piVar21] == 0.0) {
                      local_128 = 1;
                      std::
                      vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                      ::emplace_back<int_const&,int>
                                ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                                  *)&local_a8,piVar13,&local_128);
                    }
                    else {
                      local_128 = 0;
                      std::
                      vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                      ::emplace_back<int_const&,int>
                                ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                                  *)&local_a8,piVar13,&local_128);
                    }
                  }
                  piVar13 = pHVar7 + local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[uVar19];
                  if (0.0 < pdVar1[local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar19]] ||
                      pdVar1[local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar19]] == 0.0) {
                    local_128 = 1;
                    std::
                    vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                    ::emplace_back<int_const&,int>
                              ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                                *)&local_a8,piVar13,&local_128);
                  }
                  else {
                    local_128 = 0;
                    std::
                    vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                    ::emplace_back<int_const&,int>
                              ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                                *)&local_a8,piVar13,&local_128);
                  }
                  uVar15 = (long)local_a8.
                                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_a8.
                                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 2;
                  if (1 < uVar15) {
                    addClique(local_d8,local_118,
                              local_a8.
                              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              ._M_impl.super__Vector_impl_data._M_start,(HighsInt)uVar15,false,
                              0x7fffffff);
                    bVar22 = true;
                    if (((pHVar2->domain).infeasible_ != false) ||
                       ((int)local_120 <= local_d8->numEntries)) goto LAB_00264582;
                  }
                  bVar22 = piVar20 ==
                           local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar19;
                }
LAB_00264582:
              } while (((!bVar22) && (uVar19 = uVar19 - 1, (int)uVar19 != 0)) &&
                      (local_d8->numEntries < (int)local_120));
            }
          }
          if (local_a8.
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_start != (CliqueVar *)0x0) {
            operator_delete(local_a8.
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
    }
  }
  return;
}

Assistant:

void HighsCliqueTable::extractCliquesFromCut(const HighsMipSolver& mipsolver,
                                             const HighsInt* inds,
                                             const double* vals, HighsInt len,
                                             double rhs) {
  if (isFull()) return;

  HighsImplications& implics = mipsolver.mipdata_->implications;
  HighsDomain& globaldom = mipsolver.mipdata_->domain;

  const double feastol = mipsolver.mipdata_->feastol;

  HighsCDouble minact = 0.0;
  HighsInt nbin = 0;
  for (HighsInt i = 0; i != len; ++i) {
    if (globaldom.isBinary(inds[i])) ++nbin;

    if (vals[i] > 0) {
      if (globaldom.col_lower_[inds[i]] == -kHighsInf) return;
      minact += vals[i] * globaldom.col_lower_[inds[i]];
    } else {
      if (globaldom.col_upper_[inds[i]] == kHighsInf) return;
      minact += vals[i] * globaldom.col_upper_[inds[i]];
    }
  }

  for (HighsInt i = 0; i != len; ++i) {
    if (mipsolver.variableType(inds[i]) == HighsVarType::kContinuous) continue;

    double boundVal = double((rhs - minact) / vals[i]);
    if (vals[i] > 0) {
      boundVal = std::floor(boundVal + globaldom.col_lower_[inds[i]] +
                            globaldom.feastol());
      globaldom.changeBound(HighsBoundType::kUpper, inds[i], boundVal,
                            HighsDomain::Reason::unspecified());
      if (globaldom.infeasible()) return;
    } else {
      boundVal = std::ceil(boundVal + globaldom.col_upper_[inds[i]] -
                           globaldom.feastol());
      globaldom.changeBound(HighsBoundType::kLower, inds[i], boundVal,
                            HighsDomain::Reason::unspecified());
      if (globaldom.infeasible()) return;
    }
  }

  if (nbin <= 1) return;

  std::vector<HighsInt> perm;
  perm.resize(len);
  std::iota(perm.begin(), perm.end(), 0);

  auto binaryend = std::partition(perm.begin(), perm.end(), [&](HighsInt pos) {
    return globaldom.isBinary(inds[pos]);
  });

  nbin = binaryend - perm.begin();

  // if not all variables are binary, we extract variable upper and lower bounds
  // constraints on the non-binary variable for each binary variable in the
  // constraint:
  if (nbin < len) {
    for (HighsInt i = 0; i != nbin; ++i) {
      HighsInt bincol = inds[perm[i]];
      HighsCDouble impliedActivity = rhs - minact - std::abs(vals[perm[i]]);
      for (HighsInt j = nbin; j != len; ++j) {
        HighsInt col = inds[perm[j]];
        if (globaldom.isFixed(col)) continue;

        if (vals[perm[j]] > 0) {
          double implcolub = double(impliedActivity +
                                    vals[perm[j]] * globaldom.col_lower_[col]) /
                             vals[perm[j]];
          if (mipsolver.variableType(col) != HighsVarType::kContinuous)
            implcolub = std::floor(implcolub + mipsolver.mipdata_->feastol);

          if (implcolub < globaldom.col_upper_[col] - feastol) {
            double coef;
            double constant;
            if (vals[perm[i]] < 0) {
              coef = globaldom.col_upper_[col] - implcolub;
              constant = implcolub;
            } else {
              // make sure that upper bound is not infinite to avoid adding VUB
              // with coefficient '-kHighsInf' and constant 'kHighsInf'
              if (globaldom.col_upper_[col] == kHighsInf) continue;
              coef = implcolub - globaldom.col_upper_[col];
              constant = globaldom.col_upper_[col];
            }
            // printf("extracted VUB from cut: x%" HIGHSINT_FORMAT " <= %g*y%"
            // HIGHSINT_FORMAT " + %g\n", col, coef,
            //        bincol, constant);
            implics.addVUB(col, bincol, coef, constant);
          }
        } else {
          double implcollb = double(impliedActivity +
                                    vals[perm[j]] * globaldom.col_upper_[col]) /
                             vals[perm[j]];
          if (mipsolver.variableType(col) != HighsVarType::kContinuous)
            implcollb = std::ceil(implcollb - mipsolver.mipdata_->feastol);

          if (implcollb > globaldom.col_lower_[col] + feastol) {
            double coef;
            double constant;
            if (vals[perm[i]] < 0) {
              coef = globaldom.col_lower_[col] - implcollb;
              constant = implcollb;
            } else {
              // make sure that lower bound is not infinite to avoid adding VLB
              // with coefficient 'kHighsInf' and constant '-kHighsInf'
              if (globaldom.col_lower_[col] == -kHighsInf) continue;
              coef = implcollb - globaldom.col_lower_[col];
              constant = globaldom.col_lower_[col];
            }

            // printf("extracted VLB from cut: x%" HIGHSINT_FORMAT " >= %g*y%"
            // HIGHSINT_FORMAT " + %g\n", col, coef,
            //        bincol, constant);
            implics.addVLB(col, bincol, coef, constant);
            // printf("extracted VLB from cut\n");
          }
        }
      }
    }
  }

  // only one binary means we do have no cliques
  if (nbin <= 1) return;

  std::vector<CliqueVar> clique;
  clique.reserve(nbin);

  pdqsort(perm.begin(), binaryend, [&](HighsInt p1, HighsInt p2) {
    return std::make_pair(std::abs(vals[p1]), p1) >
           std::make_pair(std::abs(vals[p2]), p2);
  });
  // check if any cliques exists
  if (std::abs(vals[perm[0]]) + std::abs(vals[perm[1]]) <=
      double(rhs - minact + feastol))
    return;

  HighsInt maxNewEntries =
      std::min(mipsolver.mipdata_->numCliqueEntriesAfterPresolve + 100000 +
                   4 * globaldom.numModelNonzeros(),
               numEntries + 10 * nbin);

  for (HighsInt k = nbin - 1; k != 0 && numEntries < maxNewEntries; --k) {
    double mincliqueval =
        double(rhs - minact - std::abs(vals[perm[k]]) + feastol);
    auto cliqueend = std::partition_point(
        perm.begin(), perm.begin() + k,
        [&](HighsInt p) { return std::abs(vals[p]) > mincliqueval; });

    // no clique for this variable
    if (cliqueend == perm.begin()) continue;

    clique.clear();

    for (auto j = perm.begin(); j != cliqueend; ++j) {
      HighsInt pos = *j;
      if (vals[pos] < 0)
        clique.emplace_back(inds[pos], 0);
      else
        clique.emplace_back(inds[pos], 1);
    }

    if (vals[perm[k]] < 0)
      clique.emplace_back(inds[perm[k]], 0);
    else
      clique.emplace_back(inds[perm[k]], 1);

    // printf("extracted this clique:\n");
    // printClique(clique);
    if (clique.size() >= 2) {
      // printf("extracted clique from cut\n");
      // if (clique.size() > 2) runCliqueSubsumption(globaldom, clique);

      addClique(mipsolver, clique.data(), clique.size());
      if (globaldom.infeasible() || numEntries >= maxNewEntries) return;
    }

    // further cliques are just subsets of this clique
    if (cliqueend == perm.begin() + k) return;
  }
}